

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void xmlAddDefAttrs(xmlParserCtxtPtr ctxt,xmlChar *fullname,xmlChar *fullattr,xmlChar *value)

{
  xmlChar *name;
  int iVar1;
  void *pvVar2;
  xmlHashTablePtr pxVar3;
  xmlChar *pxVar4;
  xmlChar *pxVar5;
  int *piVar6;
  int *userdata;
  char *pcVar7;
  bool bVar8;
  int len;
  int local_3c;
  xmlChar *local_38;
  
  if ((ctxt->attsSpecial != (xmlHashTablePtr)0x0) &&
     (pvVar2 = xmlHashLookup2(ctxt->attsSpecial,fullname,fullattr), pvVar2 != (void *)0x0)) {
    return;
  }
  local_38 = value;
  if (ctxt->attsDefault == (xmlHashTablePtr)0x0) {
    pxVar3 = xmlHashCreateDict(10,ctxt->dict);
    ctxt->attsDefault = pxVar3;
    if (pxVar3 == (xmlHashTablePtr)0x0) goto LAB_0015e0f7;
  }
  pxVar4 = xmlSplitQName3(fullname,&local_3c);
  if (pxVar4 == (xmlChar *)0x0) {
    pxVar4 = xmlDictLookup(ctxt->dict,fullname,-1);
    pxVar5 = (xmlChar *)0x0;
  }
  else {
    pxVar4 = xmlDictLookup(ctxt->dict,pxVar4,-1);
    pxVar5 = xmlDictLookup(ctxt->dict,fullname,local_3c);
  }
  piVar6 = (int *)xmlHashLookup2(ctxt->attsDefault,pxVar4,pxVar5);
  if (piVar6 == (int *)0x0) {
    userdata = (int *)(*xmlMalloc)(0xa8);
    if (userdata != (int *)0x0) {
      userdata[0] = 0;
      userdata[1] = 4;
      iVar1 = xmlHashUpdateEntry2(ctxt->attsDefault,pxVar4,pxVar5,userdata,(xmlHashDeallocator)0x0);
      if (-1 < iVar1) goto LAB_0015e0b9;
      (*xmlFree)(userdata);
    }
LAB_0015e0f7:
    xmlErrMemory(ctxt,(char *)0x0);
    return;
  }
  userdata = piVar6;
  if (piVar6[1] <= *piVar6) {
    userdata = (int *)(*xmlRealloc)(piVar6,(long)piVar6[1] * 0x50 + 8);
    if (userdata == (int *)0x0) {
      bVar8 = false;
      userdata = piVar6;
    }
    else {
      userdata[1] = userdata[1] << 1;
      iVar1 = xmlHashUpdateEntry2(ctxt->attsDefault,pxVar4,pxVar5,userdata,(xmlHashDeallocator)0x0);
      bVar8 = -1 < iVar1;
      if (!bVar8) {
        (*xmlFree)(userdata);
      }
    }
    if (!bVar8) goto LAB_0015e0f7;
  }
LAB_0015e0b9:
  pxVar4 = xmlSplitQName3(fullattr,&local_3c);
  if (pxVar4 == (xmlChar *)0x0) {
    pxVar4 = xmlDictLookup(ctxt->dict,fullattr,-1);
    pxVar5 = (xmlChar *)0x0;
  }
  else {
    pxVar4 = xmlDictLookup(ctxt->dict,pxVar4,-1);
    pxVar5 = xmlDictLookup(ctxt->dict,fullattr,local_3c);
  }
  name = local_38;
  iVar1 = *userdata;
  *(xmlChar **)(userdata + (long)iVar1 * 10 + 2) = pxVar4;
  *(xmlChar **)(userdata + (long)(iVar1 * 5) * 2 + 4) = pxVar5;
  local_3c = xmlStrlen(local_38);
  pxVar4 = xmlDictLookup(ctxt->dict,name,local_3c);
  iVar1 = *userdata;
  *(xmlChar **)(userdata + (long)iVar1 * 10 + 6) = pxVar4;
  *(xmlChar **)(userdata + (long)(iVar1 * 5) * 2 + 8) = pxVar4 + local_3c;
  pcVar7 = (char *)0x0;
  if (ctxt->external != 0) {
    pcVar7 = "external";
  }
  *(char **)(userdata + (long)(iVar1 * 5) * 2 + 10) = pcVar7;
  *userdata = iVar1 + 1;
  return;
}

Assistant:

static void
xmlAddDefAttrs(xmlParserCtxtPtr ctxt,
               const xmlChar *fullname,
               const xmlChar *fullattr,
               const xmlChar *value) {
    xmlDefAttrsPtr defaults;
    int len;
    const xmlChar *name;
    const xmlChar *prefix;

    /*
     * Allows to detect attribute redefinitions
     */
    if (ctxt->attsSpecial != NULL) {
        if (xmlHashLookup2(ctxt->attsSpecial, fullname, fullattr) != NULL)
	    return;
    }

    if (ctxt->attsDefault == NULL) {
        ctxt->attsDefault = xmlHashCreateDict(10, ctxt->dict);
	if (ctxt->attsDefault == NULL)
	    goto mem_error;
    }

    /*
     * split the element name into prefix:localname , the string found
     * are within the DTD and then not associated to namespace names.
     */
    name = xmlSplitQName3(fullname, &len);
    if (name == NULL) {
        name = xmlDictLookup(ctxt->dict, fullname, -1);
	prefix = NULL;
    } else {
        name = xmlDictLookup(ctxt->dict, name, -1);
	prefix = xmlDictLookup(ctxt->dict, fullname, len);
    }

    /*
     * make sure there is some storage
     */
    defaults = xmlHashLookup2(ctxt->attsDefault, name, prefix);
    if (defaults == NULL) {
        defaults = (xmlDefAttrsPtr) xmlMalloc(sizeof(xmlDefAttrs) +
	                   (4 * 5) * sizeof(const xmlChar *));
	if (defaults == NULL)
	    goto mem_error;
	defaults->nbAttrs = 0;
	defaults->maxAttrs = 4;
	if (xmlHashUpdateEntry2(ctxt->attsDefault, name, prefix,
	                        defaults, NULL) < 0) {
	    xmlFree(defaults);
	    goto mem_error;
	}
    } else if (defaults->nbAttrs >= defaults->maxAttrs) {
        xmlDefAttrsPtr temp;

        temp = (xmlDefAttrsPtr) xmlRealloc(defaults, sizeof(xmlDefAttrs) +
		       (2 * defaults->maxAttrs * 5) * sizeof(const xmlChar *));
	if (temp == NULL)
	    goto mem_error;
	defaults = temp;
	defaults->maxAttrs *= 2;
	if (xmlHashUpdateEntry2(ctxt->attsDefault, name, prefix,
	                        defaults, NULL) < 0) {
	    xmlFree(defaults);
	    goto mem_error;
	}
    }

    /*
     * Split the element name into prefix:localname , the string found
     * are within the DTD and hen not associated to namespace names.
     */
    name = xmlSplitQName3(fullattr, &len);
    if (name == NULL) {
        name = xmlDictLookup(ctxt->dict, fullattr, -1);
	prefix = NULL;
    } else {
        name = xmlDictLookup(ctxt->dict, name, -1);
	prefix = xmlDictLookup(ctxt->dict, fullattr, len);
    }

    defaults->values[5 * defaults->nbAttrs] = name;
    defaults->values[5 * defaults->nbAttrs + 1] = prefix;
    /* intern the string and precompute the end */
    len = xmlStrlen(value);
    value = xmlDictLookup(ctxt->dict, value, len);
    defaults->values[5 * defaults->nbAttrs + 2] = value;
    defaults->values[5 * defaults->nbAttrs + 3] = value + len;
    if (ctxt->external)
        defaults->values[5 * defaults->nbAttrs + 4] = BAD_CAST "external";
    else
        defaults->values[5 * defaults->nbAttrs + 4] = NULL;
    defaults->nbAttrs++;

    return;

mem_error:
    xmlErrMemory(ctxt, NULL);
    return;
}